

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_extension.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ExtensionGenerator::ExtensionGenerator
          (ExtensionGenerator *this,FieldDescriptor *descriptor,Options *options,
          MessageSCCAnalyzer *scc_analyzer)

{
  bool bVar1;
  CppType CVar2;
  Type i32;
  int i32_00;
  EnumDescriptor *pEVar3;
  Descriptor *pDVar4;
  mapped_type *pmVar5;
  string *psVar6;
  undefined1 qualified;
  char *pcVar7;
  char *pcVar8;
  FieldDescriptor *field;
  AlphaNum *a;
  FieldDescriptor *d;
  AlphaNum *a_00;
  allocator local_3a1;
  key_type local_3a0;
  AlphaNum local_380;
  string local_350;
  allocator local_329;
  key_type local_328;
  string local_308;
  allocator local_2e1;
  key_type local_2e0;
  byte local_2bb;
  allocator local_2ba;
  byte local_2b9;
  string local_2b8;
  undefined1 local_298 [8];
  string scope;
  key_type local_270;
  allocator local_249;
  key_type local_248;
  AlphaNum local_228;
  string local_1f8;
  allocator local_1d1;
  key_type local_1d0;
  string local_1b0;
  allocator local_189;
  key_type local_188;
  string local_168;
  undefined1 local_148 [8];
  string name;
  key_type local_120;
  allocator local_f9;
  key_type local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  MessageSCCAnalyzer *local_28;
  MessageSCCAnalyzer *scc_analyzer_local;
  Options *options_local;
  FieldDescriptor *descriptor_local;
  ExtensionGenerator *this_local;
  
  this->descriptor_ = descriptor;
  local_28 = scc_analyzer;
  scc_analyzer_local = (MessageSCCAnalyzer *)options;
  options_local = (Options *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  std::__cxx11::string::string((string *)&this->type_traits_);
  Options::Options(&this->options_,(Options *)scc_analyzer_local);
  this->scc_analyzer_ = local_28;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->variables_);
  bVar1 = FieldDescriptor::is_repeated(this->descriptor_);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&this->type_traits_,"Repeated");
  }
  CVar2 = FieldDescriptor::cpp_type(this->descriptor_);
  if (CVar2 == CPPTYPE_ENUM) {
    std::__cxx11::string::append((char *)&this->type_traits_);
    psVar6 = &this->type_traits_;
    pEVar3 = FieldDescriptor::enum_type(this->descriptor_);
    ClassName_abi_cxx11_(&local_58,(cpp *)pEVar3,(EnumDescriptor *)0x1,SUB81(psVar6,0));
    std::__cxx11::string::append((string *)&this->type_traits_);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::append((char *)&this->type_traits_);
    scc_analyzer = (MessageSCCAnalyzer *)&this->type_traits_;
    pEVar3 = FieldDescriptor::enum_type(this->descriptor_);
    ClassName_abi_cxx11_(&local_78,(cpp *)pEVar3,(EnumDescriptor *)0x1,SUB81(scc_analyzer,0));
    std::__cxx11::string::append((string *)&this->type_traits_);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::append((char *)&this->type_traits_);
  }
  else if (CVar2 == CPPTYPE_STRING) {
    std::__cxx11::string::append((char *)&this->type_traits_);
  }
  else if (CVar2 == CPPTYPE_MESSAGE) {
    std::__cxx11::string::append((char *)&this->type_traits_);
    scc_analyzer = (MessageSCCAnalyzer *)&this->type_traits_;
    pDVar4 = FieldDescriptor::message_type(this->descriptor_);
    ClassName_abi_cxx11_(&local_98,(cpp *)pDVar4,(Descriptor *)0x1,SUB81(scc_analyzer,0));
    std::__cxx11::string::append((string *)&this->type_traits_);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::append((char *)&this->type_traits_);
  }
  else {
    std::__cxx11::string::append((char *)&this->type_traits_);
    scc_analyzer = (MessageSCCAnalyzer *)&this->options_;
    CVar2 = FieldDescriptor::cpp_type(this->descriptor_);
    PrimitiveTypeName_abi_cxx11_
              (&local_b8,(cpp *)&this->options_,(Options *)(ulong)CVar2,(CppType)scc_analyzer);
    std::__cxx11::string::append((string *)&this->type_traits_);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::append((char *)&this->type_traits_);
  }
  SetCommonVars((Options *)scc_analyzer_local,&this->variables_);
  pDVar4 = FieldDescriptor::containing_type(this->descriptor_);
  QualifiedClassName_abi_cxx11_
            (&local_d8,(cpp *)pDVar4,(Descriptor *)&this->options_,(Options *)scc_analyzer);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"extendee",&local_f9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_f8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_120,"type_traits",(allocator *)(name.field_2._M_local_buf + 0xf));
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_120);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&this->type_traits_);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
  psVar6 = FieldDescriptor::name_abi_cxx11_(this->descriptor_);
  std::__cxx11::string::string((string *)local_148,(string *)psVar6);
  ResolveKeyword(&local_168,(string *)local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"name",&local_189);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_188);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string((string *)&local_168);
  FieldConstantName_abi_cxx11_(&local_1b0,(cpp *)this->descriptor_,field);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"constant_name",&local_1d1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_1d0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string((string *)&local_1b0);
  i32 = FieldDescriptor::type(this->descriptor_);
  strings::AlphaNum::AlphaNum(&local_228,i32);
  StrCat_abi_cxx11_(&local_1f8,(protobuf *)&local_228,a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_248,"field_type",&local_249);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_248);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string((string *)&local_1f8);
  bVar1 = FieldDescriptor::is_packed(this->descriptor_);
  pcVar7 = "false";
  if (bVar1) {
    pcVar7 = "true";
  }
  pcVar8 = pcVar7;
  std::allocator<char>::allocator();
  qualified = SUB81(pcVar8,0);
  std::__cxx11::string::string
            ((string *)&local_270,"packed",(allocator *)(scope.field_2._M_local_buf + 0xf));
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_270);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar7);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)(scope.field_2._M_local_buf + 0xf));
  local_2b9 = 0;
  local_2bb = 0;
  bVar1 = IsScoped(this);
  if (bVar1) {
    pDVar4 = FieldDescriptor::extension_scope(this->descriptor_);
    ClassName_abi_cxx11_(&local_2b8,(cpp *)pDVar4,(Descriptor *)0x0,(bool)qualified);
    local_2b9 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                   &local_2b8,"::");
  }
  else {
    std::allocator<char>::allocator();
    local_2bb = 1;
    std::__cxx11::string::string((string *)local_298,"",&local_2ba);
  }
  if ((local_2bb & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_2ba);
  }
  if ((local_2b9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2b8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e0,"scope",&local_2e1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_2e0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)local_298);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  ExtensionName_abi_cxx11_(&local_308,(cpp *)this->descriptor_,d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"scoped_name",&local_329);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_328);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_308);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::__cxx11::string::~string((string *)&local_308);
  i32_00 = FieldDescriptor::number(this->descriptor_);
  strings::AlphaNum::AlphaNum(&local_380,i32_00);
  StrCat_abi_cxx11_(&local_350,(protobuf *)&local_380,a_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a0,"number",&local_3a1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_3a0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_350);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)local_298);
  std::__cxx11::string::~string((string *)local_148);
  return;
}

Assistant:

ExtensionGenerator::ExtensionGenerator(const FieldDescriptor* descriptor,
                                       const Options& options,
                                       MessageSCCAnalyzer* scc_analyzer)
    : descriptor_(descriptor), options_(options), scc_analyzer_(scc_analyzer) {
  // Construct type_traits_.
  if (descriptor_->is_repeated()) {
    type_traits_ = "Repeated";
  }

  switch (descriptor_->cpp_type()) {
    case FieldDescriptor::CPPTYPE_ENUM:
      type_traits_.append("EnumTypeTraits< ");
      type_traits_.append(ClassName(descriptor_->enum_type(), true));
      type_traits_.append(", ");
      type_traits_.append(ClassName(descriptor_->enum_type(), true));
      type_traits_.append("_IsValid>");
      break;
    case FieldDescriptor::CPPTYPE_STRING:
      type_traits_.append("StringTypeTraits");
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      type_traits_.append("MessageTypeTraits< ");
      type_traits_.append(ClassName(descriptor_->message_type(), true));
      type_traits_.append(" >");
      break;
    default:
      type_traits_.append("PrimitiveTypeTraits< ");
      type_traits_.append(PrimitiveTypeName(options_, descriptor_->cpp_type()));
      type_traits_.append(" >");
      break;
  }
  SetCommonVars(options, &variables_);
  variables_["extendee"] =
      QualifiedClassName(descriptor_->containing_type(), options_);
  variables_["type_traits"] = type_traits_;
  std::string name = descriptor_->name();
  variables_["name"] = ResolveKeyword(name);
  variables_["constant_name"] = FieldConstantName(descriptor_);
  variables_["field_type"] =
      StrCat(static_cast<int>(descriptor_->type()));
  variables_["packed"] = descriptor_->is_packed() ? "true" : "false";

  std::string scope =
      IsScoped() ? ClassName(descriptor_->extension_scope(), false) + "::" : "";
  variables_["scope"] = scope;
  variables_["scoped_name"] = ExtensionName(descriptor_);
  variables_["number"] = StrCat(descriptor_->number());
}